

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_MD5.cc
# Opt level: O3

ssize_t __thiscall Pl_MD5::write(Pl_MD5 *this,int __fd,void *__buf,size_t __n)

{
  Pipeline *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  void *pvVar3;
  void *len;
  undefined4 in_register_00000034;
  char *data;
  
  if (this->enabled == true) {
    if (this->in_progress == false) {
      MD5::reset(&this->md5);
      this->in_progress = true;
    }
    if (__buf != (void *)0x0) {
      pvVar3 = __buf;
      data = (char *)CONCAT44(in_register_00000034,__fd);
      do {
        len = (void *)0x40000000;
        if (pvVar3 < (void *)0x40000000) {
          len = pvVar3;
        }
        MD5::encodeDataIncrementally(&this->md5,data,(size_t)len);
        data = data + (long)len;
        pvVar3 = (void *)((long)pvVar3 - (long)len);
      } while (pvVar3 != (void *)0x0);
    }
  }
  pPVar1 = (this->super_Pipeline).next_;
  iVar2 = (*pPVar1->_vptr_Pipeline[2])(pPVar1,(char *)CONCAT44(in_register_00000034,__fd),__buf);
  return CONCAT44(extraout_var,iVar2);
}

Assistant:

void
Pl_MD5::write(unsigned char const* buf, size_t len)
{
    if (this->enabled) {
        if (!this->in_progress) {
            this->md5.reset();
            this->in_progress = true;
        }

        // Write in chunks in case len is too big to fit in an int. Assume int is at least 32 bits.
        static size_t const max_bytes = 1 << 30;
        size_t bytes_left = len;
        unsigned char const* data = buf;
        while (bytes_left > 0) {
            size_t bytes = (bytes_left >= max_bytes ? max_bytes : bytes_left);
            this->md5.encodeDataIncrementally(reinterpret_cast<char const*>(data), bytes);
            bytes_left -= bytes;
            data += bytes;
        }
    }

    next()->write(buf, len);
}